

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomNormalLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomnormallike
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  RandomNormalLikeLayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x492) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x492;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::RandomNormalLikeLayerParams>(arena);
    (this->layer_).randomnormallike_ = pRVar2;
  }
  return (RandomNormalLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalLikeLayerParams* NeuralNetworkLayer::_internal_mutable_randomnormallike() {
  if (!_internal_has_randomnormallike()) {
    clear_layer();
    set_has_randomnormallike();
    layer_.randomnormallike_ = CreateMaybeMessage< ::CoreML::Specification::RandomNormalLikeLayerParams >(GetArenaForAllocation());
  }
  return layer_.randomnormallike_;
}